

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void anon_unknown.dwarf_ae8::ndiIRCHKHelper(ndicapi *pol,char *command,char *commandReply)

{
  char cVar1;
  long lVar2;
  int i;
  byte bVar3;
  char cVar4;
  
  bVar3 = 0;
  if (command[5] == ' ') {
    cVar1 = command[6];
joined_r0x001089eb:
    if (cVar1 != '\r') {
      lVar2 = 0;
      bVar3 = 0;
      do {
        cVar1 = command[lVar2 + 6];
        cVar4 = -0x57;
        if (((5 < (byte)(cVar1 + 0x9fU)) && (cVar4 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
           (cVar4 = '\0', 9 < (byte)(cVar1 - 0x30U))) break;
        bVar3 = cVar4 + cVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      if ((bVar3 & 1) == 0) goto LAB_00108a4a;
    }
  }
  else if (command[5] == ':') {
    cVar1 = command[10];
    goto joined_r0x001089eb;
  }
  cVar1 = *commandReply;
  commandReply = commandReply + 1;
  pol->IrchkDetected = (int)cVar1;
LAB_00108a4a:
  if ((bVar3 & 2) != 0) {
    lVar2 = 0;
    do {
      if (commandReply[lVar2] < ' ') {
        return;
      }
      pol->IrchkSources[lVar2] = commandReply[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x7e);
  }
  return;
}

Assistant:

void ndiIRCHKHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    int j;

    // if the IRCHK command had a reply mode, read it
    if ((command[5] == ':' && command[10] != '\r') || (command[5] == ' ' && command[6] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[6], 4);
    }

    // a single character, '0' or '1'
    if (mode & NDI_DETECTED)
    {
      pol->IrchkDetected = *commandReply++;
    }

    // maximum string length for 20 sources is 2*(3 + 20*3) = 126
    // copy until a control char (less than 0x20) is found
    if (mode & NDI_SOURCES)
    {
      for (j = 0; j < 126 && *commandReply >= ' '; j++)
      {
        pol->IrchkSources[j] = *commandReply++;
      }
    }
  }